

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix3 * matrix3_inverse(matrix3 *self,matrix3 *mR)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  matrix3 inverse;
  
  fVar1 = (self->field_0).m[0];
  fVar2 = (self->field_0).m[1];
  fVar3 = (self->field_0).m[4];
  fVar4 = (self->field_0).m[8];
  fVar5 = (self->field_0).m[7];
  fVar6 = (self->field_0).m[5];
  inverse.field_0.m[0] = fVar3 * fVar4 - fVar6 * fVar5;
  fVar7 = (self->field_0).m[3];
  fVar8 = (self->field_0).m[6];
  fVar9 = (self->field_0).m[2];
  inverse.field_0.m[6] = fVar7 * fVar5 - fVar3 * fVar8;
  fVar12 = fVar9 * inverse.field_0.m[6] +
           (fVar1 * inverse.field_0.m[0] - (fVar7 * fVar4 - fVar6 * fVar8) * fVar2);
  fVar11 = -fVar12;
  if (-fVar12 <= fVar12) {
    fVar11 = fVar12;
  }
  if (1e-05 <= fVar11) {
    inverse.field_0.m[1] = fVar5 * fVar9 + -fVar2 * fVar4;
    inverse.field_0.m[2] = fVar2 * fVar6 - fVar9 * fVar3;
    inverse.field_0.m[3] = fVar6 * fVar8 - fVar7 * fVar4;
    inverse.field_0.m[4] = fVar4 * fVar1 - fVar8 * fVar9;
    inverse.field_0.m[5] = fVar9 * fVar7 - fVar6 * fVar1;
    inverse.field_0.m[7] = fVar8 * fVar2 - fVar5 * fVar1;
    inverse.field_0.m[8] = fVar1 * fVar3 - fVar2 * fVar7;
    lVar10 = 0;
    do {
      (mR->field_0).m[lVar10] = inverse.field_0.m[lVar10] * (1.0 / fVar12);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 9);
    return mR;
  }
  return (matrix3 *)0x0;
}

Assistant:

HYPAPI struct matrix3 *matrix3_inverse(const struct matrix3 *self, struct matrix3 *mR)
{
	struct matrix3 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix3_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	matrix3_identity(&inverse);

	/* find the adjugate of self */
	B(11) = A2(22, 33) - A2(32, 23);
	B(12) = A2(32, 13) - A2(12, 33);
	B(13) = A2(12, 23) - A2(22, 13);

	B(21) = A2(23, 31) - A2(33, 21);
	B(22) = A2(33, 11) - A2(13, 31);
	B(23) = A2(13, 21) - A2(23, 11);

	B(31) = A2(21, 32) - A2(31, 22);
	B(32) = A2(31, 12) - A2(11, 32);
	B(33) = A2(11, 22) - A2(21, 12);

	/* divide the determinant */
	for (i = 0; i < 9; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}